

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,TableDefine *table,void *data)

{
  bool bVar1;
  pointer pSVar2;
  int *in_RDX;
  long in_RSI;
  Function *in_RDI;
  Guard g;
  int r;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *field;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
  *__range2;
  TableFieldData field_data;
  Instruction instruction;
  Function *function;
  int end_register;
  int register_id;
  ExpVarData_conflict *exp_var_data;
  vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
  *in_stack_fffffffffffffef8;
  Guard *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff10;
  Instruction in_stack_ffffffffffffff14;
  function<void_()> *in_stack_ffffffffffffff18;
  Function *this_00;
  Guard local_d0;
  vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
  local_a8 [2];
  int local_64;
  reference local_60;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *local_58;
  __normal_iterator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_*,_std::vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>_>
  local_50;
  long local_48;
  TableFieldData local_40;
  uint local_38;
  uint local_34;
  Function *local_30;
  int local_28;
  int local_24;
  long local_10;
  
  local_24 = *in_RDX;
  local_28 = in_RDX[1];
  if ((local_28 == -1) || (local_24 < local_28)) {
    local_10 = in_RSI;
    local_30 = GetCurrentFunction((CodeGenerateVisitor *)in_RDI);
    local_38 = (uint)Instruction::ACode((OpType)in_stack_ffffffffffffff00,
                                        (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    local_34 = local_38;
    Function::AddInstruction
              (in_RDI,in_stack_ffffffffffffff14,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    bVar1 = std::
            vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
            ::empty((vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
                     *)CONCAT44(in_stack_ffffffffffffff14.opcode_,in_stack_ffffffffffffff10));
    if (!bVar1) {
      TableFieldData::TableFieldData(&local_40,local_24);
      local_48 = local_10 + 8;
      local_50._M_current =
           (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
           std::
           vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
           ::begin(in_stack_fffffffffffffef8);
      local_58 = (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                 std::
                 vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
                 ::end(in_stack_fffffffffffffef8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_*,_std::vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>_>
                                 *)in_stack_ffffffffffffff00,
                                (__normal_iterator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_*,_std::vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>_>
                                 *)in_stack_fffffffffffffef8), bVar1) {
        local_60 = __gnu_cxx::
                   __normal_iterator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_*,_std::vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>_>
                   ::operator*(&local_50);
        local_64 = GetNextRegisterId((CodeGenerateVisitor *)in_RDI);
        in_stack_fffffffffffffef8 = local_a8;
        std::function<void()>::
        function<luna::CodeGenerateVisitor::Visit(luna::TableDefine*,void*)::__0,void>
                  ((function<void_()> *)
                   CONCAT44(in_stack_ffffffffffffff14.opcode_,in_stack_ffffffffffffff10),
                   (anon_class_1_0_00000001 *)in_RDI);
        in_stack_ffffffffffffff00 = &local_d0;
        this_00 = in_RDI;
        std::function<void()>::
        function<luna::CodeGenerateVisitor::Visit(luna::TableDefine*,void*)::__1,void>
                  ((function<void_()> *)
                   CONCAT44(in_stack_ffffffffffffff14.opcode_,in_stack_ffffffffffffff10),
                   (anon_class_16_2_fd512ddf *)in_RDI);
        Guard::Guard((Guard *)this_00,in_stack_ffffffffffffff18,
                     (function<void_()> *)
                     CONCAT44(in_stack_ffffffffffffff14.opcode_,in_stack_ffffffffffffff10));
        std::function<void_()>::~function((function<void_()> *)0x20ca32);
        std::function<void_()>::~function((function<void_()> *)0x20ca3c);
        pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::
                 operator->((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                            0x20ca49);
        (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,&local_40);
        Guard::~Guard(in_stack_ffffffffffffff00);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_*,_std::vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>_>
        ::operator++(&local_50);
      }
    }
    FillRemainRegisterNil
              ((CodeGenerateVisitor *)
               CONCAT44(in_stack_ffffffffffffff14.opcode_,in_stack_ffffffffffffff10),
               (int)((ulong)in_RDI >> 0x20),(int)in_RDI,
               (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  }
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(TableDefine *table, void *data)
    {
        auto exp_var_data = static_cast<ExpVarData *>(data);
        auto register_id = exp_var_data->start_register_;
        auto end_register = exp_var_data->end_register_;

        // No register, then do not generate code
        if (end_register != EXP_VALUE_COUNT_ANY && register_id >= end_register)
            return ;

        // New table
        auto function = GetCurrentFunction();
        auto instruction = Instruction::ACode(OpType_NewTable, register_id);
        function->AddInstruction(instruction, table->line_);

        if (!table->fields_.empty())
        {
            // Init table value
            TableFieldData field_data{ register_id };
            for (auto &field : table->fields_)
            {
                REGISTER_GENERATOR_GUARD();
                field->Accept(this, &field_data);
            }
        }

        FillRemainRegisterNil(register_id + 1, end_register, table->line_);
    }